

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O2

aiNode * __thiscall
Assimp::ObjFileImporter::createNodes
          (ObjFileImporter *this,Model *pModel,Object *pObject,aiNode *pParent,aiScene *pScene,
          vector<aiMesh_*,_std::allocator<aiMesh_*>_> *MeshArray)

{
  uint uVar1;
  long lVar2;
  pointer puVar3;
  pointer ppOVar4;
  pointer ppOVar5;
  aiNode *this_00;
  aiMesh *this_01;
  aiNode **ppaVar6;
  uint *puVar7;
  ulong uVar8;
  pointer ppaVar9;
  size_t i;
  ulong uVar10;
  pointer ppaVar11;
  long lVar12;
  aiMesh *pMesh;
  
  if (pModel == (Model *)0x0) {
    __assert_fail("__null != pModel",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                  ,0x104,
                  "aiNode *Assimp::ObjFileImporter::createNodes(const ObjFile::Model *, const ObjFile::Object *, aiNode *, aiScene *, std::vector<aiMesh *> &)"
                 );
  }
  if (pObject == (Object *)0x0) {
    this_00 = (aiNode *)0x0;
  }
  else {
    ppaVar9 = (MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    ppaVar11 = (MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    uVar10 = (pObject->m_strObjName)._M_string_length;
    if (uVar10 < 0x400) {
      (this_00->mName).length = (ai_uint32)uVar10;
      memcpy((this_00->mName).data,(pObject->m_strObjName)._M_dataplus._M_p,uVar10);
      (this_00->mName).data[uVar10] = '\0';
    }
    if (pParent == (aiNode *)0x0) {
      __assert_fail("__null != pParent",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                    ,0x110,
                    "aiNode *Assimp::ObjFileImporter::createNodes(const ObjFile::Model *, const ObjFile::Object *, aiNode *, aiScene *, std::vector<aiMesh *> &)"
                   );
    }
    lVar2 = (long)ppaVar9 - (long)ppaVar11 >> 3;
    this_00->mParent = pParent;
    uVar1 = pParent->mNumChildren;
    pParent->mNumChildren = uVar1 + 1;
    pParent->mChildren[uVar1] = this_00;
    for (uVar10 = 0;
        puVar3 = (pObject->m_Meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar10 < (ulong)((long)(pObject->m_Meshes).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2);
        uVar10 = uVar10 + 1) {
      this_01 = createTopology(this,pModel,pObject,puVar3[uVar10]);
      pMesh = this_01;
      if (this_01 != (aiMesh *)0x0) {
        if (this_01->mNumFaces == 0) {
          aiMesh::~aiMesh(this_01);
          operator_delete(this_01,0x520);
        }
        else {
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(MeshArray,&pMesh);
        }
      }
    }
    ppOVar4 = (pObject->m_SubObjects).
              super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppOVar5 = (pObject->m_SubObjects).
              super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppOVar4 != ppOVar5) {
      uVar10 = (long)ppOVar5 - (long)ppOVar4;
      uVar8 = (long)uVar10 >> 3;
      this_00->mNumChildren = (uint)uVar8;
      ppaVar6 = (aiNode **)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar10);
      this_00->mChildren = ppaVar6;
      this_00->mNumMeshes = 1;
      puVar7 = (uint *)operator_new__(4);
      this_00->mMeshes = puVar7;
    }
    ppaVar9 = (MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppaVar11 = (MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    uVar10 = ((long)ppaVar11 - (long)ppaVar9 >> 3) - lVar2;
    if (uVar10 != 0) {
      puVar7 = (uint *)operator_new__(-(ulong)(uVar10 >> 0x3e != 0) | uVar10 * 4);
      this_00->mMeshes = puVar7;
      this_00->mNumMeshes = (uint)uVar10;
      for (lVar12 = 0; (ulong)(lVar2 + lVar12) < (ulong)((long)ppaVar11 - (long)ppaVar9 >> 3);
          lVar12 = lVar12 + 1) {
        uVar1 = pScene->mNumMeshes;
        this_00->mMeshes[lVar12] = uVar1;
        pScene->mNumMeshes = uVar1 + 1;
        ppaVar9 = (MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppaVar11 = (MeshArray->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
      }
    }
  }
  return this_00;
}

Assistant:

aiNode *ObjFileImporter::createNodes(const ObjFile::Model* pModel, const ObjFile::Object* pObject,
                                     aiNode *pParent, aiScene* pScene,
                                     std::vector<aiMesh*> &MeshArray )
{
    ai_assert( NULL != pModel );
    if( NULL == pObject ) {
        return NULL;
    }

    // Store older mesh size to be able to computes mesh offsets for new mesh instances
    const size_t oldMeshSize = MeshArray.size();
    aiNode *pNode = new aiNode;

    pNode->mName = pObject->m_strObjName;

    // If we have a parent node, store it
    ai_assert( NULL != pParent );
    appendChildToParentNode( pParent, pNode );

    for ( size_t i=0; i< pObject->m_Meshes.size(); ++i ) {
        unsigned int meshId = pObject->m_Meshes[ i ];
        aiMesh *pMesh = createTopology( pModel, pObject, meshId );
        if( pMesh ) {
            if (pMesh->mNumFaces > 0) {
                MeshArray.push_back( pMesh );
            } else {
                delete pMesh;
            }
        }
    }

    // Create all nodes from the sub-objects stored in the current object
    if ( !pObject->m_SubObjects.empty() ) {
        size_t numChilds = pObject->m_SubObjects.size();
        pNode->mNumChildren = static_cast<unsigned int>( numChilds );
        pNode->mChildren = new aiNode*[ numChilds ];
        pNode->mNumMeshes = 1;
        pNode->mMeshes = new unsigned int[ 1 ];
    }

    // Set mesh instances into scene- and node-instances
    const size_t meshSizeDiff = MeshArray.size()- oldMeshSize;
    if ( meshSizeDiff > 0 ) {
        pNode->mMeshes = new unsigned int[ meshSizeDiff ];
        pNode->mNumMeshes = static_cast<unsigned int>( meshSizeDiff );
        size_t index = 0;
        for (size_t i = oldMeshSize; i < MeshArray.size(); ++i ) {
            pNode->mMeshes[ index ] = pScene->mNumMeshes;
            pScene->mNumMeshes++;
            ++index;
        }
    }

    return pNode;
}